

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>
::reject(AdapterPromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>
         *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> local_190;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::ExceptionOr
              (&local_190,false,exception_00);
    ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::operator=
              (&this->result,&local_190);
    ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::~ExceptionOr(&local_190);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }